

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::SetupLegacyScriptPubKeyMan(CWallet *this)

{
  bool bVar1;
  pointer pWVar2;
  pointer pSVar3;
  long in_FS_OFFSET;
  value_type *type;
  unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_> spk_manager;
  uint256 id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
  *in_stack_ffffffffffffff20;
  CWallet *in_stack_ffffffffffffff28;
  uint256 *in_stack_ffffffffffffff30;
  CWallet *in_stack_ffffffffffffff38;
  CWallet *in_stack_ffffffffffffff40;
  long *__args_1;
  undefined7 in_stack_ffffffffffffff50;
  bool local_8d;
  undefined1 local_48 [32];
  long local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::
          map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
          ::empty((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                   *)in_stack_ffffffffffffff18);
  if ((((bVar1) &&
       (bVar1 = std::
                map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                ::empty((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                         *)in_stack_ffffffffffffff18), bVar1)) &&
      (bVar1 = std::
               map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
               ::empty((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
                        *)in_stack_ffffffffffffff18), bVar1)) &&
     (bVar1 = IsWalletFlagSet(in_stack_ffffffffffffff28,(uint64_t)in_stack_ffffffffffffff20), !bVar1
     )) {
    pWVar2 = std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
             operator->((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                         *)in_stack_ffffffffffffff18);
    __args_1 = local_28;
    (*pWVar2->_vptr_WalletDatabase[0xd])();
    local_8d = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
    if (local_8d) {
      std::make_unique<wallet::LegacyDataSPKM,wallet::CWallet&>(in_stack_ffffffffffffff40);
    }
    else {
      std::make_unique<wallet::LegacyScriptPubKeyMan,wallet::CWallet&,long&>
                ((CWallet *)CONCAT17(local_8d,in_stack_ffffffffffffff50),__args_1);
      std::unique_ptr<wallet::LegacyDataSPKM,std::default_delete<wallet::LegacyDataSPKM>>::
      unique_ptr<wallet::LegacyScriptPubKeyMan,std::default_delete<wallet::LegacyScriptPubKeyMan>,void>
                ((unique_ptr<wallet::LegacyDataSPKM,_std::default_delete<wallet::LegacyDataSPKM>_> *
                 )in_stack_ffffffffffffff28,
                 (unique_ptr<wallet::LegacyScriptPubKeyMan,_std::default_delete<wallet::LegacyScriptPubKeyMan>_>
                  *)in_stack_ffffffffffffff20);
    }
    local_8d = !local_8d;
    std::unique_ptr<wallet::ScriptPubKeyMan,std::default_delete<wallet::ScriptPubKeyMan>>::
    unique_ptr<wallet::LegacyDataSPKM,std::default_delete<wallet::LegacyDataSPKM>,void>
              ((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_> *
               )in_stack_ffffffffffffff28,
               (unique_ptr<wallet::LegacyDataSPKM,_std::default_delete<wallet::LegacyDataSPKM>_> *)
               in_stack_ffffffffffffff20);
    std::unique_ptr<wallet::LegacyDataSPKM,_std::default_delete<wallet::LegacyDataSPKM>_>::
    ~unique_ptr((unique_ptr<wallet::LegacyDataSPKM,_std::default_delete<wallet::LegacyDataSPKM>_> *)
                in_stack_ffffffffffffff28);
    if (local_8d) {
      std::
      unique_ptr<wallet::LegacyScriptPubKeyMan,_std::default_delete<wallet::LegacyScriptPubKeyMan>_>
      ::~unique_ptr((unique_ptr<wallet::LegacyScriptPubKeyMan,_std::default_delete<wallet::LegacyScriptPubKeyMan>_>
                     *)in_stack_ffffffffffffff28);
    }
    std::__cxx11::string::~string(in_stack_ffffffffffffff18);
    std::
    unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
    ::begin(in_stack_ffffffffffffff20);
    std::
    unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
    ::end(in_stack_ffffffffffffff20);
    while (bVar1 = std::__detail::operator==
                             ((_Node_iterator_base<OutputType,_false> *)in_stack_ffffffffffffff28,
                              (_Node_iterator_base<OutputType,_false> *)in_stack_ffffffffffffff20),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      std::__detail::_Node_const_iterator<OutputType,_true,_false>::operator*
                ((_Node_const_iterator<OutputType,_true,_false> *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff38 =
           (CWallet *)
           std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>::
           get((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_> *
               )in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff40 =
           (CWallet *)
           std::
           map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
           ::operator[]((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                         *)in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
      (in_stack_ffffffffffffff40->super_WalletStorage)._vptr_WalletStorage =
           (_func_int **)in_stack_ffffffffffffff38;
      in_stack_ffffffffffffff28 =
           (CWallet *)
           std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>::
           get((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_> *
               )in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff30 =
           (uint256 *)
           std::
           map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
           ::operator[]((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                         *)in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
      *(CWallet **)(in_stack_ffffffffffffff30->super_base_blob<256U>).m_data._M_elems =
           in_stack_ffffffffffffff28;
      std::__detail::_Node_const_iterator<OutputType,_true,_false>::operator++
                ((_Node_const_iterator<OutputType,_true,_false> *)in_stack_ffffffffffffff18);
    }
    pSVar3 = std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
             ::operator->((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                           *)in_stack_ffffffffffffff18);
    (*pSVar3->_vptr_ScriptPubKeyMan[0x1a])(local_48);
    std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>::
    unique_ptr((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_> *
               )in_stack_ffffffffffffff18,
               (unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_> *
               )0x170fbaf);
    AddScriptPubKeyMan(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                       (unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                        *)in_stack_ffffffffffffff28);
    std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>::
    ~unique_ptr((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                 *)in_stack_ffffffffffffff28);
    std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>::
    ~unique_ptr((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                 *)in_stack_ffffffffffffff28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::SetupLegacyScriptPubKeyMan()
{
    if (!m_internal_spk_managers.empty() || !m_external_spk_managers.empty() || !m_spk_managers.empty() || IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        return;
    }

    std::unique_ptr<ScriptPubKeyMan> spk_manager = m_database->Format() == "bdb_ro" ?
        std::make_unique<LegacyDataSPKM>(*this) :
        std::make_unique<LegacyScriptPubKeyMan>(*this, m_keypool_size);

    for (const auto& type : LEGACY_OUTPUT_TYPES) {
        m_internal_spk_managers[type] = spk_manager.get();
        m_external_spk_managers[type] = spk_manager.get();
    }
    uint256 id = spk_manager->GetID();
    AddScriptPubKeyMan(id, std::move(spk_manager));
}